

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

void Fossilize::filter_feature_enablement
               (VkPhysicalDeviceFeatures2 *pdf,VulkanFeatures *features,
               VkPhysicalDeviceFeatures2 *target_features,char **active_extensions,
               size_t *out_extension_count)

{
  VkBool32 VVar1;
  int iVar2;
  VkBaseInStructure *sin;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  VkBool32 VVar9;
  VkBool32 VVar10;
  VkBool32 VVar11;
  void **ppvVar12;
  bool bVar13;
  
  VVar9 = (features->fragment_shading_rate).pipelineFragmentShadingRate;
  VVar10 = (features->fragment_shading_rate).primitiveFragmentShadingRate;
  VVar1 = (features->fragment_shading_rate).attachmentFragmentShadingRate;
  if (VVar10 == 1 || (VVar1 == 1 || VVar9 == 1)) {
    (features->shading_rate_nv).shadingRateImage = 0;
    (features->shading_rate_nv).shadingRateCoarseSampleOrder = 0;
    (features->fragment_density).fragmentDensityMap = 0;
  }
  if (target_features != (VkPhysicalDeviceFeatures2 *)0x0) {
    if ((pdf->features).robustBufferAccess == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)((target_features->features).robustBufferAccess != 0);
    }
    (pdf->features).robustBufferAccess = uVar7;
    piVar6 = (int *)target_features->pNext;
    for (piVar3 = piVar6; piVar5 = piVar6, piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
      if (*piVar3 == 0x3b9f2730) {
        VVar11 = 0;
        uVar7 = 0;
        if ((features->robustness2).robustBufferAccess2 != 0) {
          uVar7 = (uint)(piVar3[4] != 0);
        }
        (features->robustness2).robustBufferAccess2 = uVar7;
        if ((features->robustness2).robustImageAccess2 != 0) {
          VVar11 = (VkBool32)(piVar3[5] != 0);
        }
        (features->robustness2).robustImageAccess2 = VVar11;
        if ((features->robustness2).nullDescriptor == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)(piVar3[6] != 0);
        }
        (features->robustness2).nullDescriptor = uVar7;
        goto LAB_0016aeda;
      }
    }
    (features->robustness2).nullDescriptor = 0;
    (features->robustness2).robustBufferAccess2 = 0;
    (features->robustness2).robustImageAccess2 = 0;
LAB_0016aeda:
    do {
      piVar3 = piVar6;
      if (piVar5 == (int *)0x0) goto LAB_0016aeee;
      if (*piVar5 == 0x3b9fe698) {
        if ((features->image_robustness).robustImageAccess == 0) {
          VVar11 = 0;
        }
        else {
          VVar11 = (VkBool32)(piVar5[4] != 0);
        }
        (features->image_robustness).robustImageAccess = VVar11;
        goto LAB_0016af1b;
      }
      piVar5 = *(int **)(piVar5 + 2);
    } while( true );
  }
  (pdf->features).robustBufferAccess = 0;
  (features->robustness2).nullDescriptor = 0;
  (features->robustness2).robustBufferAccess2 = 0;
  (features->robustness2).robustImageAccess2 = 0;
  (features->image_robustness).robustImageAccess = 0;
  (features->fragment_shading_rate_enums).fragmentShadingRateEnums = 0;
  (features->fragment_shading_rate_enums).supersampleFragmentShadingRates = 0;
  (features->fragment_shading_rate_enums).noInvocationFragmentShadingRates = 0;
  (features->fragment_shading_rate).pipelineFragmentShadingRate = 0;
  (features->fragment_shading_rate).primitiveFragmentShadingRate = 0;
  (features->fragment_shading_rate).attachmentFragmentShadingRate = 0;
  (features->mesh_shader).meshShaderQueries = 0;
  (features->mesh_shader).taskShader = 0;
  (features->mesh_shader).meshShader = 0;
  (features->mesh_shader).multiviewMeshShader = 0;
  (features->mesh_shader).primitiveFragmentShadingRateMeshShader = 0;
  (features->mesh_shader_nv).taskShader = 0;
  (features->mesh_shader_nv).meshShader = 0;
  (features->descriptor_buffer).descriptorBuffer = 0;
  (features->descriptor_buffer).descriptorBufferCaptureReplay = 0;
  (features->descriptor_buffer).descriptorBufferImageLayoutIgnored = 0;
  (features->descriptor_buffer).descriptorBufferPushDescriptors = 0;
  (features->shader_object).shaderObject = 0;
  (features->primitives_generated_query).primitivesGeneratedQuery = 0;
  (features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard = 0;
  (features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams = 0;
LAB_0016b2b9:
  (features->image_2d_view_of_3d).image2DViewOf3D = 0;
  (features->image_2d_view_of_3d).sampler2DViewOf3D = 0;
LAB_0016b2fa:
  piVar3 = (int *)pdf->pNext;
  pdf->pNext = (void *)0x0;
  ppvVar12 = &pdf->pNext;
LAB_0016b315:
  if (piVar3 == (int *)0x0) {
    return;
  }
  piVar6 = *(int **)(piVar3 + 2);
  iVar2 = *piVar3;
  if (iVar2 == 0x3b9ddf10) {
    if ((piVar3[5] == 0) && (piVar3[4] == 0)) {
      remove_extension(active_extensions,out_extension_count,"VK_NV_mesh_shader");
      piVar3 = piVar6;
      goto LAB_0016b315;
    }
  }
  else {
    if (iVar2 == 0x3b9e3cd3) {
      if (((piVar3[6] != 0) || (piVar3[4] != 0)) || (piVar3[5] != 0)) goto LAB_0016b544;
      remove_extension(active_extensions,out_extension_count,"VK_KHR_fragment_shading_rate");
      piVar3 = piVar6;
      goto LAB_0016b315;
    }
    if (iVar2 == 0x3b9f2730) {
      if (((piVar3[6] == 0) && (piVar3[4] == 0)) && (piVar3[5] == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_robustness2");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
    }
    else if (iVar2 == 0x3b9f9c62) {
      if (((piVar3[4] == 0) && (piVar3[5] == 0)) && ((piVar3[6] == 0 && (piVar3[7] == 0)))) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_descriptor_buffer");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
    }
    else if (iVar2 == 0x3ba224d0) {
      if (piVar3[4] == 0) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_shader_object");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
    }
    else if (iVar2 == 0x3b9fcb40) {
      if ((((piVar3[5] == 0) && (piVar3[4] == 0)) && (piVar3[6] == 0)) &&
         ((piVar3[7] == 0 && (piVar3[8] == 0)))) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_mesh_shader");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
    }
    else if (iVar2 == 0x3b9fe698) {
      if (piVar3[4] == 0) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_image_robustness");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
    }
    else if (iVar2 == 0x3ba09e30) {
      if (((piVar3[4] == 0) && (piVar3[6] == 0)) && (piVar3[5] == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_primitives_generated_query");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
    }
    else {
      if (iVar2 != 0x3ba0c928) {
        if ((((iVar2 != 0x3b9fc371) || (piVar3[4] != 0)) || (piVar3[6] != 0)) || (piVar3[5] != 0))
        goto LAB_0016b544;
        remove_extension(active_extensions,out_extension_count,"VK_NV_fragment_shading_rate_enums");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
      if ((piVar3[4] == 0) && (piVar3[5] == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_image_2d_view_of_3d");
        piVar3 = piVar6;
        goto LAB_0016b315;
      }
    }
  }
LAB_0016b544:
  *ppvVar12 = piVar3;
  ppvVar12 = (void **)(piVar3 + 2);
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3 = piVar6;
  goto LAB_0016b315;
LAB_0016aeee:
  (features->image_robustness).robustImageAccess = 0;
LAB_0016af1b:
  do {
    piVar5 = piVar6;
    if (piVar3 == (int *)0x0) break;
    if (*piVar3 == 0x3b9fc371) {
      VVar11 = 0;
      uVar7 = 0;
      if ((features->fragment_shading_rate_enums).fragmentShadingRateEnums != 0) {
        uVar7 = (uint)(piVar3[4] != 0);
      }
      (features->fragment_shading_rate_enums).fragmentShadingRateEnums = uVar7;
      if ((features->fragment_shading_rate_enums).noInvocationFragmentShadingRates != 0) {
        VVar11 = (VkBool32)(piVar3[6] != 0);
      }
      (features->fragment_shading_rate_enums).noInvocationFragmentShadingRates = VVar11;
      if ((features->fragment_shading_rate_enums).supersampleFragmentShadingRates == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)(piVar3[5] != 0);
      }
      (features->fragment_shading_rate_enums).supersampleFragmentShadingRates = uVar7;
      goto LAB_0016afa2;
    }
    piVar3 = *(int **)(piVar3 + 2);
  } while( true );
  (features->fragment_shading_rate_enums).fragmentShadingRateEnums = 0;
  (features->fragment_shading_rate_enums).supersampleFragmentShadingRates = 0;
  (features->fragment_shading_rate_enums).noInvocationFragmentShadingRates = 0;
LAB_0016afa2:
  do {
    if (piVar5 == (int *)0x0) break;
    if (*piVar5 == 0x3b9e3cd3) {
      VVar11 = 0;
      uVar7 = 0;
      if (VVar9 != 0) {
        uVar7 = (uint)(piVar5[4] != 0);
      }
      (features->fragment_shading_rate).pipelineFragmentShadingRate = uVar7;
      if (VVar10 != 0) {
        VVar11 = (VkBool32)(piVar5[5] != 0);
      }
      (features->fragment_shading_rate).primitiveFragmentShadingRate = VVar11;
      if (VVar1 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)(piVar5[6] != 0);
      }
      bVar13 = VVar11 == 0;
      goto LAB_0016b014;
    }
    piVar5 = *(int **)(piVar5 + 2);
  } while( true );
  (features->fragment_shading_rate).pipelineFragmentShadingRate = 0;
  (features->fragment_shading_rate).primitiveFragmentShadingRate = 0;
  bVar13 = true;
  uVar7 = 0;
LAB_0016b014:
  (features->fragment_shading_rate).attachmentFragmentShadingRate = uVar7;
  for (piVar3 = piVar6; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3b9fcb40) {
      VVar9 = 0;
      VVar10 = 0;
      if ((features->mesh_shader).taskShader != 0) {
        VVar10 = (VkBool32)(piVar3[4] != 0);
      }
      (features->mesh_shader).taskShader = VVar10;
      if ((features->mesh_shader).meshShader != 0) {
        VVar9 = (VkBool32)(piVar3[5] != 0);
      }
      (features->mesh_shader).meshShader = VVar9;
      VVar9 = 0;
      VVar10 = 0;
      if ((features->mesh_shader).multiviewMeshShader != 0) {
        VVar10 = (VkBool32)(piVar3[6] != 0);
      }
      (features->mesh_shader).multiviewMeshShader = VVar10;
      if ((features->mesh_shader).meshShaderQueries != 0) {
        VVar9 = (VkBool32)(piVar3[8] != 0);
      }
      (features->mesh_shader).meshShaderQueries = VVar9;
      VVar9 = 0;
      if (!(bool)((features->mesh_shader).primitiveFragmentShadingRateMeshShader == 0 | bVar13)) {
        VVar9 = (VkBool32)(piVar3[7] != 0);
      }
      (features->mesh_shader).primitiveFragmentShadingRateMeshShader = VVar9;
      piVar5 = piVar6;
      goto LAB_0016b0f4;
    }
  }
  (features->mesh_shader).taskShader = 0;
  (features->mesh_shader).meshShader = 0;
  (features->mesh_shader).multiviewMeshShader = 0;
  (features->mesh_shader).primitiveFragmentShadingRateMeshShader = 0;
  (features->mesh_shader).meshShaderQueries = 0;
  piVar6 = (int *)target_features->pNext;
  piVar5 = piVar6;
LAB_0016b0f4:
  do {
    piVar4 = piVar5;
    if (piVar6 == (int *)0x0) break;
    if (*piVar6 == 0x3b9ddf10) {
      VVar9 = 0;
      VVar10 = 0;
      if ((features->mesh_shader_nv).taskShader != 0) {
        VVar10 = (VkBool32)(piVar3[4] != 0);
      }
      (features->mesh_shader_nv).taskShader = VVar10;
      if ((features->mesh_shader_nv).meshShader != 0) {
        VVar9 = (VkBool32)(piVar3[5] != 0);
      }
      (features->mesh_shader_nv).meshShader = VVar9;
      goto LAB_0016b154;
    }
    piVar6 = *(int **)(piVar6 + 2);
  } while( true );
  (features->mesh_shader_nv).taskShader = 0;
  (features->mesh_shader_nv).meshShader = 0;
LAB_0016b154:
  do {
    if (piVar4 == (int *)0x0) break;
    if (*piVar4 == 0x3b9f9c62) {
      uVar7 = 0;
      VVar9 = 0;
      if ((features->descriptor_buffer).descriptorBuffer != 0) {
        VVar9 = (VkBool32)(piVar4[4] != 0);
      }
      (features->descriptor_buffer).descriptorBuffer = VVar9;
      if ((features->descriptor_buffer).descriptorBufferCaptureReplay != 0) {
        uVar7 = (uint)(piVar4[5] != 0);
      }
      (features->descriptor_buffer).descriptorBufferCaptureReplay = uVar7;
      uVar7 = 0;
      VVar9 = 0;
      if ((features->descriptor_buffer).descriptorBufferImageLayoutIgnored != 0) {
        VVar9 = (VkBool32)(piVar4[6] != 0);
      }
      (features->descriptor_buffer).descriptorBufferImageLayoutIgnored = VVar9;
      if ((features->descriptor_buffer).descriptorBufferPushDescriptors != 0) {
        uVar7 = (uint)(piVar4[7] != 0);
      }
      (features->descriptor_buffer).descriptorBufferPushDescriptors = uVar7;
      piVar3 = piVar5;
      goto LAB_0016b1f0;
    }
    piVar4 = *(int **)(piVar4 + 2);
  } while( true );
  (features->descriptor_buffer).descriptorBuffer = 0;
  (features->descriptor_buffer).descriptorBufferCaptureReplay = 0;
  (features->descriptor_buffer).descriptorBufferImageLayoutIgnored = 0;
  (features->descriptor_buffer).descriptorBufferPushDescriptors = 0;
  piVar5 = (int *)target_features->pNext;
  piVar3 = piVar5;
LAB_0016b1f0:
  do {
    piVar6 = piVar3;
    if (piVar5 == (int *)0x0) break;
    if (*piVar5 == 0x3ba224d0) {
      if ((features->shader_object).shaderObject == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)(piVar5[4] != 0);
      }
      (features->shader_object).shaderObject = uVar7;
      goto LAB_0016b22b;
    }
    piVar5 = *(int **)(piVar5 + 2);
  } while( true );
  (features->shader_object).shaderObject = 0;
LAB_0016b22b:
  do {
    if (piVar6 == (int *)0x0) break;
    if (*piVar6 == 0x3ba09e30) {
      uVar7 = 0;
      VVar9 = 0;
      if ((features->primitives_generated_query).primitivesGeneratedQuery != 0) {
        VVar9 = (VkBool32)(piVar6[4] != 0);
      }
      (features->primitives_generated_query).primitivesGeneratedQuery = VVar9;
      if ((features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams != 0) {
        uVar7 = (uint)(piVar6[6] != 0);
      }
      (features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams = uVar7;
      if ((features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard == 0)
      {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)(piVar6[5] != 0);
      }
      (features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard = uVar7;
      goto LAB_0016b2b4;
    }
    piVar6 = *(int **)(piVar6 + 2);
  } while( true );
  (features->primitives_generated_query).primitivesGeneratedQuery = 0;
  (features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard = 0;
  (features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams = 0;
LAB_0016b2b4:
  do {
    if (piVar3 == (int *)0x0) goto LAB_0016b2b9;
    if (*piVar3 == 0x3ba0c928) {
      uVar7 = 0;
      uVar8 = 0;
      if ((features->image_2d_view_of_3d).image2DViewOf3D != 0) {
        uVar8 = (uint)(piVar3[4] != 0);
      }
      (features->image_2d_view_of_3d).image2DViewOf3D = uVar8;
      if ((features->image_2d_view_of_3d).sampler2DViewOf3D != 0) {
        uVar7 = (uint)(piVar3[5] != 0);
      }
      (features->image_2d_view_of_3d).sampler2DViewOf3D = uVar7;
      goto LAB_0016b2fa;
    }
    piVar3 = *(int **)(piVar3 + 2);
  } while( true );
}

Assistant:

void filter_feature_enablement(VkPhysicalDeviceFeatures2 &pdf,
                               VulkanFeatures &features,
                               const VkPhysicalDeviceFeatures2 *target_features,
							   const char **active_extensions, size_t *out_extension_count)
{
	filter_feature_enablement(pdf, features, target_features);
	filter_active_extensions(pdf, active_extensions, out_extension_count);
}